

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

int log_aspect_destroy(log_aspect aspect)

{
  uint uVar1;
  void *in_RDI;
  size_t iterator;
  int result;
  log_policy in_stack_ffffffffffffffd8;
  undefined8 local_20;
  undefined4 local_14;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 0;
  }
  else {
    local_14 = (**(code **)(*(long *)((long)in_RDI + 0x30) + 0x10))(in_RDI);
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      for (local_20 = 0; local_20 < *(ulong *)((long)in_RDI + 0x18); local_20 = local_20 + 1) {
        uVar1 = log_policy_destroy(in_stack_ffffffffffffffd8);
        local_14 = uVar1 | local_14;
      }
      free(*(void **)((long)in_RDI + 0x10));
    }
    free(in_RDI);
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int log_aspect_destroy(log_aspect aspect)
{
	if (aspect != NULL)
	{
		int result = aspect->iface->destroy(aspect);

		if (aspect->policies)
		{
			size_t iterator;

			for (iterator = 0; iterator < aspect->count; ++iterator)
			{
				result |= log_policy_destroy(aspect->policies[iterator]);
			}

			free(aspect->policies);
		}

		free(aspect);

		return result;
	}

	return 0;
}